

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createCommonEdgeTests(TestContext *testCtx)

{
  TestContext *testCtx_00;
  TestCaseGroup *pTVar1;
  ostream *poVar2;
  TestNode *node;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  pointer pcVar7;
  allocator<char> local_1fd;
  int local_1fc;
  ulong local_1f8;
  pointer local_1f0;
  long local_1e8;
  char *local_1e0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_1c8;
  string local_1a8 [11];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  uVar3 = 0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  while (pTVar1 = group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr, uVar3 != 2) {
    local_1e8 = (long)(int)createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[uVar3];
    local_1f0 = (pointer)(ulong)createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[uVar3];
    iVar4 = 0;
    local_1f8 = uVar3;
    while (iVar4 != 2) {
      local_1e0 = "";
      if (iVar4 == 1) {
        local_1e0 = "_precise";
      }
      pcVar7 = local_1f0;
      local_1fc = iVar4;
      for (lVar6 = 0;
          pTVar1 = group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, lVar6 != 0x18; lVar6 = lVar6 + 8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        if ((local_1f8 & 0x3ffffffffffffffe) == 0) {
          pcVar5 = *(char **)(&DAT_00bdb380 + local_1e8 * 8);
        }
        else {
          pcVar5 = (char *)0x0;
        }
        poVar2 = std::operator<<((ostream *)local_1a8,pcVar5);
        poVar2 = std::operator<<(poVar2,"_");
        poVar2 = std::operator<<(poVar2,*(char **)((long)&PTR_anon_var_dwarf_fa11a3_00bdb398 + lVar6
                                                  ));
        std::operator<<(poVar2,local_1e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"",&local_1fd);
        testCtx_00 = (pTVar1->super_TestNode).m_testCtx;
        node = (TestNode *)operator_new(0x90);
        TestCase::TestCase((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,&local_1c8,local_1a8);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bdb2f0;
        node[1]._vptr_TestNode = (_func_int **)anon_unknown_2::initPrograms;
        node[1].m_testCtx = (TestContext *)anon_unknown_2::test;
        node[1].m_name._M_dataplus._M_p = pcVar7;
        *(int *)&node[1].m_name._M_string_length = local_1fc;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,node);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar7 = pcVar7 + 0x100000000;
      }
      iVar4 = local_1fc + 1;
    }
    uVar3 = local_1f8 + 1;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createCommonEdgeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them"));

	static const TessPrimitiveType primitiveTypes[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	for (int caseTypeNdx = 0; caseTypeNdx < CASETYPE_LAST; ++caseTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitiveTypes[primitiveTypeNdx];
		const CaseType			caseType	  = static_cast<CaseType>(caseTypeNdx);
		const SpacingMode		spacingMode   = static_cast<SpacingMode>(spacingModeNdx);
		const CaseDefinition	caseDef		  = { primitiveType, spacingMode, caseType };

		addFunctionCaseWithPrograms(group.get(), getCaseName(primitiveType, spacingMode, caseType), "", initPrograms, test, caseDef);
	}

	return group.release();
}